

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_X86.cpp
# Opt level: O1

void NULLC::DenyMemoryPageRead(void *addr)

{
  mprotect((void *)(((ulong)addr & 0xfffffffffffff000) + 0x1000),0x1000,0);
  return;
}

Assistant:

void DenyMemoryPageRead(void *addr)
	{
		void *alignedAddr = (void*)((uintptr_t(addr) & ~4095) + 4096);

#ifndef __linux
		DWORD unusedProtect;
		VirtualProtect(alignedAddr, 4096, PAGE_NOACCESS, &unusedProtect);
#else
		mprotect(alignedAddr, 4096, PROT_NONE);
#endif
	}